

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

int lj_cconv_multi_init(CTState *cts,CType *d,TValue *o)

{
  CType *pCVar1;
  TValue *o_local;
  CType *d_local;
  CTState *cts_local;
  
  if (((d->info & 0xfc000000) == 0x30000000) || (d->info >> 0x1c == 1)) {
    if (((int)(o->field_4).it >> 0xf == -0xc) ||
       (((int)(o->field_4).it >> 0xf == -5 && (d->info >> 0x1c != 1)))) {
      cts_local._4_4_ = 0;
    }
    else {
      if (((int)(o->field_4).it >> 0xf == -0xb) &&
         (pCVar1 = lj_ctype_rawref(cts,(uint)*(ushort *)((o->u64 & 0x7fffffffffff) + 10)),
         pCVar1 == d)) {
        return 0;
      }
      cts_local._4_4_ = 1;
    }
  }
  else {
    cts_local._4_4_ = 0;
  }
  return cts_local._4_4_;
}

Assistant:

int lj_cconv_multi_init(CTState *cts, CType *d, TValue *o)
{
  if (!(ctype_isrefarray(d->info) || ctype_isstruct(d->info)))
    return 0;  /* Destination is not an aggregate. */
  if (tvistab(o) || (tvisstr(o) && !ctype_isstruct(d->info)))
    return 0;  /* Initializer is not a value. */
  if (tviscdata(o) && lj_ctype_rawref(cts, cdataV(o)->ctypeid) == d)
    return 0;  /* Source and destination are identical aggregates. */
  return 1;  /* Otherwise the initializer is a value. */
}